

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall
wasm::MultiMemoryLowering::MultiMemoryLowering(MultiMemoryLowering *this,bool checkBounds)

{
  (this->super_Pass).runner = (PassRunner *)0x0;
  (this->super_Pass).name._M_dataplus._M_p = (pointer)&(this->super_Pass).name.field_2;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass).name.field_2._M_local_buf[0] = '\0';
  (this->super_Pass).passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__MultiMemoryLowering_01122d48;
  this->isExported = false;
  this->wasm = (Module *)0x0;
  (this->combinedMemory).super_IString.str._M_len = 0;
  (this->combinedMemory).super_IString.str._M_str = (char *)0x0;
  (this->pointerType).id = 0;
  (this->module).super_IString.str._M_len = 0;
  (this->module).super_IString.str._M_str = (char *)0x0;
  (this->base).super_IString.str._M_len = 0;
  (this->base).super_IString.str._M_str = (char *)0x0;
  (this->totalInitialPages).addr = 0;
  (this->totalMaxPages).addr = 0;
  (this->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoryIdxMap)._M_h._M_buckets = &(this->memoryIdxMap)._M_h._M_single_bucket;
  (this->memoryIdxMap)._M_h._M_bucket_count = 1;
  (this->memoryIdxMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memoryIdxMap)._M_h._M_element_count = 0;
  (this->memoryIdxMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memorySizeNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memorySizeNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memorySizeNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memoryIdxMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->memoryIdxMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->checkBounds = checkBounds;
  return;
}

Assistant:

MultiMemoryLowering(bool checkBounds) : checkBounds(checkBounds) {}